

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

bool kratos::MultipleDriverVisitor::has_for_loop(Stmt *stmt)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar3;
  Stmt *stmt_00;
  
  bVar1 = true;
  if (stmt->type_ != For) {
    iVar2 = (*(stmt->super_IRNode)._vptr_IRNode[4])();
    stmt_00 = (Stmt *)CONCAT44(extraout_var,iVar2);
    if ((stmt_00 == (Stmt *)0x0) || ((stmt_00->super_IRNode).ast_node_type_ != StmtKind)) {
      bVar3 = 0;
    }
    else {
      bVar1 = has_for_loop(stmt_00);
      stmt_00 = (Stmt *)(ulong)bVar1;
      bVar3 = 1;
    }
    bVar1 = (bool)((byte)stmt_00 & bVar3);
  }
  return bVar1;
}

Assistant:

static bool has_for_loop(Stmt* stmt) {
        if (stmt->type() == StatementType::For) {
            return true;
        } else {
            auto* p = stmt->parent();
            if (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
                return has_for_loop(reinterpret_cast<Stmt*>(p));
            }
        }
        return false;
    }